

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::set_custom_data
          (task_impl_base<_1a67ba37_> *this,shared_ptr<void> *custom_data)

{
  bool bVar1;
  invalid_parameter *this_00;
  element_type *node;
  shared_ptr<void> local_60;
  undefined1 local_4d;
  allocator local_39;
  string local_38;
  shared_ptr<void> *local_18;
  shared_ptr<void> *custom_data_local;
  task_impl_base<_1a67ba37_> *this_local;
  
  local_18 = custom_data;
  custom_data_local = (shared_ptr<void> *)this;
  ensure_task_not_running(this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)custom_data);
  if (!bVar1) {
    local_4d = 1;
    this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"custom data pointer",&local_39);
    invalid_parameter::invalid_parameter(this_00,&local_38);
    local_4d = 0;
    __cxa_throw(this_00,&invalid_parameter::typeinfo,invalid_parameter::~invalid_parameter);
  }
  node = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )&this->node_);
  std::shared_ptr<void>::shared_ptr(&local_60,custom_data);
  node_manip::set_custom_data(node,&local_60);
  std::shared_ptr<void>::~shared_ptr(&local_60);
  return;
}

Assistant:

void set_custom_data(std::shared_ptr<void> custom_data) override {
        ensure_task_not_running();
        if (!custom_data) {
            throw transwarp::invalid_parameter("custom data pointer");
        }
        transwarp::detail::node_manip::set_custom_data(*node_, std::move(custom_data));
    }